

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int match_class(int c,int cl)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((cl & 0xc0U) != 0x40) goto LAB_0011b0b7;
  uVar2 = cl & 0x1f;
  uVar3 = (ulong)uVar2;
  if ((0xfe56ef65U >> uVar2 & 1) == 0) {
    uVar2 = (uint)((""[(ulong)(uint)c + 1] & ""[uVar3]) == 0);
    if ((cl & 0x20U) != 0) {
      uVar2 = (uint)(""[(ulong)(uint)c + 1] & ""[uVar3]);
    }
LAB_0011b0b1:
    bVar1 = false;
  }
  else {
    if (cl == 0x5a) {
      uVar2 = (uint)(c != 0);
      goto LAB_0011b0b1;
    }
    if (cl == 0x7a) {
      uVar2 = (uint)(c == 0);
      goto LAB_0011b0b1;
    }
    bVar1 = true;
  }
  if (!bVar1) {
    return uVar2;
  }
LAB_0011b0b7:
  return (uint)(cl == c);
}

Assistant:

static int match_class(int c, int cl)
{
  if ((cl & 0xc0) == 0x40) {
    int t = match_class_map[(cl&0x1f)];
    if (t) {
      t = lj_char_isa(c, t);
      return (cl & 0x20) ? t : !t;
    }
    if (cl == 'z') return c == 0;
    if (cl == 'Z') return c != 0;
  }
  return (cl == c);
}